

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O2

OPJ_BOOL opj_mct_decode_custom
                   (OPJ_BYTE *pDecodingData,OPJ_SIZE_T n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  float *pfVar1;
  OPJ_BOOL OVar2;
  void *ptr;
  ulong uVar3;
  OPJ_SIZE_T OVar4;
  ulong uVar5;
  OPJ_BYTE *pOVar6;
  long lVar7;
  float fVar8;
  
  ptr = opj_malloc((ulong)(pNbComp * 2) << 2);
  if (ptr == (void *)0x0) {
    OVar2 = 0;
  }
  else {
    uVar3 = (ulong)pNbComp;
    for (OVar4 = 0; OVar4 != n; OVar4 = OVar4 + 1) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)ptr + uVar5 * 4) = *(undefined4 *)pData[uVar5];
      }
      pOVar6 = pDecodingData;
      for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)ptr + uVar5 * 4 + uVar3 * 4) = 0;
        fVar8 = 0.0;
        for (lVar7 = 0; uVar3 * 4 - lVar7 != 0; lVar7 = lVar7 + 4) {
          fVar8 = fVar8 + *(float *)(pOVar6 + lVar7) * *(float *)((long)ptr + lVar7);
          *(float *)((long)ptr + uVar5 * 4 + uVar3 * 4) = fVar8;
        }
        pfVar1 = (float *)pData[uVar5];
        pData[uVar5] = (OPJ_BYTE *)(pfVar1 + 1);
        *pfVar1 = fVar8;
        pOVar6 = pOVar6 + lVar7;
      }
    }
    opj_free(ptr);
    OVar2 = 1;
  }
  return OVar2;
}

Assistant:

OPJ_BOOL opj_mct_decode_custom(
    OPJ_BYTE * pDecodingData,
    OPJ_SIZE_T n,
    OPJ_BYTE ** pData,
    OPJ_UINT32 pNbComp,
    OPJ_UINT32 isSigned)
{
    OPJ_FLOAT32 * lMct;
    OPJ_SIZE_T i;
    OPJ_UINT32 j;
    OPJ_UINT32 k;

    OPJ_FLOAT32 * lCurrentData = 00;
    OPJ_FLOAT32 * lCurrentResult = 00;
    OPJ_FLOAT32 ** lData = (OPJ_FLOAT32 **) pData;

    OPJ_ARG_NOT_USED(isSigned);

    lCurrentData = (OPJ_FLOAT32 *) opj_malloc(2 * pNbComp * sizeof(OPJ_FLOAT32));
    if (! lCurrentData) {
        return OPJ_FALSE;
    }
    lCurrentResult = lCurrentData + pNbComp;

    for (i = 0; i < n; ++i) {
        lMct = (OPJ_FLOAT32 *) pDecodingData;
        for (j = 0; j < pNbComp; ++j) {
            lCurrentData[j] = (OPJ_FLOAT32)(*(lData[j]));
        }
        for (j = 0; j < pNbComp; ++j) {
            lCurrentResult[j] = 0;
            for (k = 0; k < pNbComp; ++k) {
                lCurrentResult[j] += *(lMct++) * lCurrentData[k];
            }
            *(lData[j]++) = (OPJ_FLOAT32)(lCurrentResult[j]);
        }
    }
    opj_free(lCurrentData);
    return OPJ_TRUE;
}